

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QDBusMenuEvent>::emplace<QDBusMenuEvent_const&>
          (QMovableArrayOps<QDBusMenuEvent> *this,qsizetype i,QDBusMenuEvent *args)

{
  QDBusMenuEvent **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QDBusMenuEvent *pQVar4;
  QDBusMenuEvent *pQVar5;
  Data *pDVar6;
  QArrayData *pQVar7;
  char16_t *pcVar8;
  qsizetype qVar9;
  long in_FS_OFFSET;
  bool bVar10;
  QDBusMenuEvent tmp;
  Inserter local_b0;
  int local_88;
  undefined4 uStack_84;
  QArrayData *pQStack_80;
  char16_t *local_78;
  qsizetype qStack_70;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0063da66:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    _local_88 = CONCAT44(0xaaaaaaaa,args->m_id);
    pQStack_80 = &((args->m_eventId).d.d)->super_QArrayData;
    local_78 = (args->m_eventId).d.ptr;
    qStack_70 = (args->m_eventId).d.size;
    if (pQStack_80 != (QArrayData *)0x0) {
      LOCK();
      (((Data *)pQStack_80)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (((Data *)pQStack_80)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    ::QVariant::QVariant((QVariant *)&local_68,&(args->m_data).m_variant);
    local_48 = (undefined1 *)CONCAT44(local_48._4_4_,args->m_timestamp);
    bVar10 = (this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>.
             size != 0;
    QArrayDataPointer<QDBusMenuEvent>::detachAndGrow
              ((QArrayDataPointer<QDBusMenuEvent> *)this,(uint)(i == 0 && bVar10),1,
               (QDBusMenuEvent **)0x0,(QArrayDataPointer<QDBusMenuEvent> *)0x0);
    qVar9 = qStack_70;
    pcVar8 = local_78;
    pQVar7 = pQStack_80;
    if (i == 0 && bVar10) {
      pQVar4 = (this->super_QGenericArrayOps<QDBusMenuEvent>).
               super_QArrayDataPointer<QDBusMenuEvent>.ptr;
      pQVar4[-1].m_id = local_88;
      pQStack_80 = (QArrayData *)0x0;
      pQVar4[-1].m_eventId.d.d = (Data *)pQVar7;
      local_78 = (char16_t *)0x0;
      pQVar4[-1].m_eventId.d.ptr = pcVar8;
      qStack_70 = 0;
      pQVar4[-1].m_eventId.d.size = qVar9;
      *(undefined8 *)((long)&pQVar4[-1].m_data.m_variant.d.data + 0x10) = local_68._16_8_;
      *(undefined1 **)&pQVar4[-1].m_data.m_variant.d.field_0x18 = puStack_50;
      pQVar4[-1].m_data.m_variant.d.data.shared = local_68.shared;
      *(undefined8 *)((long)&pQVar4[-1].m_data.m_variant.d.data + 8) = local_68._8_8_;
      local_68.shared = (PrivateShared *)0x0;
      local_68._8_8_ = 0;
      local_68._16_8_ = 0;
      puStack_50 = (undefined1 *)0x2;
      pQVar4[-1].m_timestamp = (uint)local_48;
      ppQVar1 = &(this->super_QGenericArrayOps<QDBusMenuEvent>).
                 super_QArrayDataPointer<QDBusMenuEvent>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QDBusMenuEvent>).
                super_QArrayDataPointer<QDBusMenuEvent>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      pQVar5 = (this->super_QGenericArrayOps<QDBusMenuEvent>).
               super_QArrayDataPointer<QDBusMenuEvent>.ptr;
      pQVar4 = pQVar5 + i + 1;
      local_b0.nInserts = 1;
      local_b0.bytes =
           ((this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>.
            size - i) * 0x48;
      local_b0.data = (QArrayDataPointer<QDBusMenuEvent> *)this;
      local_b0.displaceTo = pQVar4;
      memmove(pQVar4,pQVar5 + i,local_b0.bytes);
      qVar9 = qStack_70;
      pcVar8 = local_78;
      pQVar7 = pQStack_80;
      pQVar4[-1].m_id = local_88;
      pQStack_80 = (QArrayData *)0x0;
      pQVar4[-1].m_eventId.d.d = (Data *)pQVar7;
      local_78 = (char16_t *)0x0;
      pQVar4[-1].m_eventId.d.ptr = pcVar8;
      qStack_70 = 0;
      pQVar4[-1].m_eventId.d.size = qVar9;
      *(undefined8 *)((long)&pQVar4[-1].m_data.m_variant.d.data + 0x10) = local_68._16_8_;
      *(undefined1 **)&pQVar4[-1].m_data.m_variant.d.field_0x18 = puStack_50;
      pQVar4[-1].m_data.m_variant.d.data.shared = local_68.shared;
      *(undefined8 *)((long)&pQVar4[-1].m_data.m_variant.d.data + 8) = local_68._8_8_;
      local_68._16_8_ = 0;
      local_68.shared = (PrivateShared *)0x0;
      local_68._8_8_ = 0;
      puStack_50 = (undefined1 *)0x2;
      pQVar4[-1].m_timestamp = (uint)local_48;
      local_b0.displaceFrom = pQVar4;
      Inserter::~Inserter(&local_b0);
    }
    ::QVariant::~QVariant((QVariant *)&local_68);
    if (pQStack_80 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_80->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_80->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_80->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_80,2,0x10);
      }
    }
  }
  else {
    if (((this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>.size
         == i) &&
       (pQVar4 = (this->super_QGenericArrayOps<QDBusMenuEvent>).
                 super_QArrayDataPointer<QDBusMenuEvent>.ptr,
       (pDVar3->super_QArrayData).alloc - i !=
       ((long)((long)pQVar4 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       -0x71c71c71c71c71c7)) {
      pQVar4 = pQVar4 + i;
      pQVar4->m_id = args->m_id;
      pDVar6 = (args->m_eventId).d.d;
      (pQVar4->m_eventId).d.d = pDVar6;
      (pQVar4->m_eventId).d.ptr = (args->m_eventId).d.ptr;
      (pQVar4->m_eventId).d.size = (args->m_eventId).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ::QVariant::QVariant(&(pQVar4->m_data).m_variant,&(args->m_data).m_variant);
      pQVar4->m_timestamp = args->m_timestamp;
    }
    else {
      if ((i != 0) ||
         (pQVar4 = (this->super_QGenericArrayOps<QDBusMenuEvent>).
                   super_QArrayDataPointer<QDBusMenuEvent>.ptr,
         (QDBusMenuEvent *)
         ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pQVar4))
      goto LAB_0063da66;
      pQVar4[-1].m_id = args->m_id;
      pDVar6 = (args->m_eventId).d.d;
      pQVar4[-1].m_eventId.d.d = pDVar6;
      pQVar4[-1].m_eventId.d.ptr = (args->m_eventId).d.ptr;
      pQVar4[-1].m_eventId.d.size = (args->m_eventId).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ::QVariant::QVariant(&pQVar4[-1].m_data.m_variant,&(args->m_data).m_variant);
      pQVar4[-1].m_timestamp = args->m_timestamp;
      ppQVar1 = &(this->super_QGenericArrayOps<QDBusMenuEvent>).
                 super_QArrayDataPointer<QDBusMenuEvent>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>
              .size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }